

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageTypeManager::imageTypes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageTypeManager *this)

{
  pointer *ppuVar1;
  iterator __position;
  _Rb_tree_node_base *p_Var2;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->_functionTableMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 __position,(uchar *)(p_Var2 + 1));
    }
    else {
      *__position._M_current = (char)p_Var2[1]._M_color;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< uint8_t > ImageTypeManager::imageTypes()
{
    std::vector< uint8_t > type;

    for ( std::map< uint8_t, Image_Function_Helper::FunctionTableHolder >::const_iterator item = _functionTableMap.cbegin(); item != _functionTableMap.cend(); ++item )
        type.push_back( item->first );

    return type;
}